

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O2

Command * __thiscall cmState::GetCommand(Command *__return_storage_ptr__,cmState *this,string *name)

{
  string sStack_38;
  
  cmsys::SystemTools::LowerCase(&sStack_38,name);
  GetCommandByExactName(__return_storage_ptr__,this,&sStack_38);
  std::__cxx11::string::~string((string *)&sStack_38);
  return __return_storage_ptr__;
}

Assistant:

cmState::Command cmState::GetCommand(std::string const& name) const
{
  return this->GetCommandByExactName(cmSystemTools::LowerCase(name));
}